

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soa_fsa.c
# Opt level: O1

void * soa_fsa_alloc(soa_fsa_t *allocator)

{
  soa_chunk_t **ppsVar1;
  soa_chunk_t *psVar2;
  soa_chunk_t *psVar3;
  void *pvVar4;
  size_t sVar5;
  size_t __size;
  
  ppsVar1 = &allocator->allocChunk;
  if ((allocator->allocChunk == (soa_chunk_t *)0x0) || (allocator->allocChunk->freeBlocks == '\0'))
  {
    allocator->allocChunk = (soa_chunk_t *)0x0;
    psVar3 = allocator->chunks;
    psVar2 = psVar3;
    for (sVar5 = allocator->chunks_len; sVar5 != 0; sVar5 = sVar5 - 1) {
      if (psVar2->freeBlocks != '\0') {
        *ppsVar1 = psVar2;
        break;
      }
      psVar2 = psVar2 + 1;
    }
    if (allocator->allocChunk == (soa_chunk_t *)0x0) {
      sVar5 = allocator->chunks_len + 1;
      allocator->chunks_len = sVar5;
      __size = sVar5 * 0x10;
      if (psVar3 == (soa_chunk_t *)0x0) {
        psVar3 = (soa_chunk_t *)malloc(__size);
      }
      else {
        psVar3 = (soa_chunk_t *)realloc(psVar3,__size);
      }
      if (psVar3 == (soa_chunk_t *)0x0) {
        return (void *)0x0;
      }
      if (psVar3 != allocator->chunks) {
        *ppsVar1 = (soa_chunk_t *)0x0;
        allocator->deallocChunk = (soa_chunk_t *)0x0;
      }
      allocator->chunks = psVar3;
      sVar5 = allocator->chunks_len;
      soa_chunk_init(psVar3 + (sVar5 - 1),allocator->blockSize,allocator->numBlocks);
      allocator->allocChunk = psVar3 + (sVar5 - 1);
    }
  }
  psVar3 = *ppsVar1;
  if (psVar3 == (soa_chunk_t *)0x0) {
    __assert_fail("allocator->allocChunk",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/cutil/src/soa_fsa.c"
                  ,0x5b,"void *soa_fsa_alloc(soa_fsa_t *)");
  }
  if (psVar3->freeBlocks != '\0') {
    pvVar4 = soa_chunk_alloc(psVar3,allocator->blockSize);
    return pvVar4;
  }
  __assert_fail("allocator->allocChunk->freeBlocks > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/cutil/src/soa_fsa.c"
                ,0x5c,"void *soa_fsa_alloc(soa_fsa_t *)");
}

Assistant:

void * soa_fsa_alloc( soa_fsa_t *allocator )
{
  if((allocator->allocChunk == 0) || (allocator->allocChunk->freeBlocks == 0 ) ) //No free blocks in this chunk or no chunk available
  {
    //linear search through all chunks to find a free block
    size_t i;
    soa_chunk_t *chunk;
    allocator->allocChunk = 0; //invalidate allocChunk
    for(i=0,chunk=allocator->chunks;i<allocator->chunks_len;i++,chunk++)
    {
      if(chunk->freeBlocks > 0) //space available?
      {
        allocator->allocChunk = chunk;
        break;
      }
    }
    if(allocator->allocChunk == 0) //We still have not found a chunk with a free block?
    {
      soa_chunk_t *ptr;
      //grow chunk array by one
      allocator->chunks_len++;
      if (allocator->chunks == 0)
      {
         ptr = (soa_chunk_t*) malloc(allocator->chunks_len * sizeof(soa_chunk_t));
      }
      else
      {
         ptr = (soa_chunk_t*) realloc(allocator->chunks,allocator->chunks_len * sizeof(soa_chunk_t));
      }

      if(ptr)
      {
        if(ptr != allocator->chunks)
        {
          //The memory has moved, all pointers into allocator->chunks must be invalidated
          allocator->allocChunk = 0;
          allocator->deallocChunk = 0;
        }
        allocator->chunks = ptr;
        chunk = allocator->chunks+allocator->chunks_len-1; //pointer to last chunk
        soa_chunk_init(chunk,allocator->blockSize,allocator->numBlocks); //call constructor on newly created chunk
        allocator->allocChunk = chunk;
      }
      else
      {
        return (void*) 0;
      }
    }
  }
  assert(allocator->allocChunk);
  assert(allocator->allocChunk->freeBlocks > 0);      
  return soa_chunk_alloc(allocator->allocChunk,allocator->blockSize);
}